

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::OpcodeExpr<(wabt::ExprType)47>,_std::default_delete<wabt::OpcodeExpr<(wabt::ExprType)47>_>_>
 __thiscall
wabt::MakeUnique<wabt::OpcodeExpr<(wabt::ExprType)47>,wabt::Opcode&>(wabt *this,Opcode *args)

{
  OpcodeExpr<(wabt::ExprType)47> *this_00;
  Location local_40;
  Opcode local_1c;
  Opcode *local_18;
  Opcode *args_local;
  
  local_18 = args;
  args_local = (Opcode *)this;
  this_00 = (OpcodeExpr<(wabt::ExprType)47> *)operator_new(0x40);
  local_1c.enum_ = local_18->enum_;
  Location::Location(&local_40);
  OpcodeExpr<(wabt::ExprType)47>::OpcodeExpr(this_00,local_1c,&local_40);
  std::
  unique_ptr<wabt::OpcodeExpr<(wabt::ExprType)47>,std::default_delete<wabt::OpcodeExpr<(wabt::ExprType)47>>>
  ::unique_ptr<std::default_delete<wabt::OpcodeExpr<(wabt::ExprType)47>>,void>
            ((unique_ptr<wabt::OpcodeExpr<(wabt::ExprType)47>,std::default_delete<wabt::OpcodeExpr<(wabt::ExprType)47>>>
              *)this,this_00);
  return (__uniq_ptr_data<wabt::OpcodeExpr<(wabt::ExprType)47>,_std::default_delete<wabt::OpcodeExpr<(wabt::ExprType)47>_>,_true,_true>
          )(__uniq_ptr_data<wabt::OpcodeExpr<(wabt::ExprType)47>,_std::default_delete<wabt::OpcodeExpr<(wabt::ExprType)47>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}